

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O0

int h264_residual(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb,
                 int start,int end)

{
  int iVar1;
  int local_c4;
  bool local_51;
  uint local_50;
  int local_4c;
  int j;
  int i;
  int end_local;
  int start_local;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,0);
  if (iVar1 != 0) {
    return 1;
  }
  if ((slice->chroma_array_type == 1) || (slice->chroma_array_type == 2)) {
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      local_51 = (mb->coded_block_pattern & 0x30) != 0 && start == 0;
      iVar1 = h264_residual_block(str,cabac,slice,mb,mb->block_chroma_dc[local_4c],(int *)0x0,3,
                                  local_4c,0,slice->chroma_array_type * 4 + -1,
                                  slice->chroma_array_type << 2,(uint)local_51);
      if (iVar1 != 0) {
        return 1;
      }
    }
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < slice->chroma_array_type << 2; local_50 = local_50 + 1) {
        if (start == 0) {
          local_c4 = 0;
        }
        else {
          local_c4 = start + -1;
        }
        iVar1 = h264_residual_block(str,cabac,slice,mb,mb->block_chroma_ac[local_4c][(int)local_50],
                                    mb->total_coeff[local_4c + 1] + (int)local_50,4,
                                    local_4c * 8 + local_50,local_c4,end + -1,0xf,
                                    mb->coded_block_pattern & 0x20);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
  }
  else if (slice->chroma_array_type == 3) {
    iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,2);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_residual(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int start, int end) {
	if (h264_residual_luma(str, cabac, slice, mb, start, end, 0)) return 1;
	if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
		int i, j;
		for (i = 0; i < 2; i++) {
			if (h264_residual_block(str, cabac, slice, mb, mb->block_chroma_dc[i], 0, H264_CTXBLOCKCAT_CHROMA_DC, i, 0, 4 * slice->chroma_array_type - 1, 4 * slice->chroma_array_type, (mb->coded_block_pattern & 0x30) && start == 0)) return 1;
		}
		for (i = 0; i < 2; i++) {
			for (j = 0; j < 4 * slice->chroma_array_type; j++) {
				if (h264_residual_block(str, cabac, slice, mb, mb->block_chroma_ac[i][j], &mb->total_coeff[i+1][j], H264_CTXBLOCKCAT_CHROMA_AC, i * 8 + j, (start?start-1:0), end-1, 15, mb->coded_block_pattern & 0x20)) return 1;
			}
		}
	} else if (slice->chroma_array_type == 3) {
		if (h264_residual_luma(str, cabac, slice, mb, start, end, 1)) return 1;
		if (h264_residual_luma(str, cabac, slice, mb, start, end, 2)) return 1;
	}
	return 0;
}